

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertyDefinition::~IfcPropertyDefinition(IfcPropertyDefinition *this)

{
  ~IfcPropertyDefinition(this);
  operator_delete(this,0xb0);
  return;
}

Assistant:

IfcPropertyDefinition() : Object("IfcPropertyDefinition") {}